

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

int DecoNameToClass(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  PClass *pPVar2;
  PClass *val;
  PClass *pPVar3;
  FName local_24;
  
  if (numparam != 2) {
    __assert_fail("numparam == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1312,"int DecoNameToClass(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (numret != 1) {
    __assert_fail("numret == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1313,"int DecoNameToClass(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\0') {
    __assert_fail("param[0].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1314,"int DecoNameToClass(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x03') {
    __assert_fail("param[1].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1315,"int DecoNameToClass(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (ret->RegType != '\x03') {
    __assert_fail("ret->RegType == REGT_POINTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1316,"int DecoNameToClass(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  iVar1 = (param->field_0).i;
  val = PClass::FindClass(&local_24);
  pPVar2 = (PClass *)(param->field_0).field_1.a;
  pPVar3 = val;
  if (val != pPVar2) {
    do {
      pPVar3 = pPVar3->ParentClass;
      if (pPVar3 == pPVar2) break;
    } while (pPVar3 != (PClass *)0x0);
    if (pPVar3 == (PClass *)0x0) {
      val = (PClass *)0x0;
      Printf("class \'%s\' is not compatible with \'%s\'",FName::NameData.NameArray[iVar1].Text,
             FName::NameData.NameArray[(pPVar2->super_PStruct).super_PNamedType.TypeName.Index].Text
            );
    }
  }
  VMReturn::SetPointer(ret,val,1);
  return 1;
}

Assistant:

int DecoNameToClass(VMFrameStack *stack, VMValue *param, int numparam, VMReturn *ret, int numret)
{
	assert(numparam == 2);
	assert(numret == 1);
	assert(param[0].Type == REGT_INT);
	assert(param[1].Type == REGT_POINTER);
	assert(ret->RegType == REGT_POINTER);

	FName clsname = ENamedName(param[0].i);
	const PClass *cls = PClass::FindClass(clsname);
	const PClass *desttype = reinterpret_cast<PClass *>(param[0].a);

	if (!cls->IsDescendantOf(desttype))
	{
		Printf("class '%s' is not compatible with '%s'", clsname.GetChars(), desttype->TypeName.GetChars());
		cls = NULL;
	}
	ret->SetPointer(const_cast<PClass *>(cls), ATAG_OBJECT);
	return 1;
}